

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare::operator()
          (ExtensionCompare *this,ExtensionEntry *a,
          tuple<std::basic_string_view<char,_std::char_traits<char>_>,_int> *b)

{
  bool bVar1;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_int> local_28;
  
  local_28.super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_int>.
  super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl =
       ExtensionEntry::extendee(a,this->index);
  local_28.super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_int>.
  super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
       (_Head_base<1UL,_int,_false>)a->extension_number;
  bVar1 = std::
          __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_0UL,_2UL>
          ::__less(&local_28,b);
  return bVar1;
}

Assistant:

bool operator()(const ExtensionEntry& a,
                    std::tuple<absl::string_view, int> b) const {
      return std::make_tuple(a.extendee(index), a.extension_number) < b;
    }